

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O2

void __thiscall cppnet::BaseLogger::SetLevel(BaseLogger *this,LogLevel level)

{
  element_type *peVar1;
  bool bVar2;
  size_t sVar3;
  uint16_t i;
  ushort uVar4;
  uint16_t uVar5;
  Log *log;
  void *del;
  Log *local_40;
  Log *local_38;
  
  uVar5 = (uint16_t)level;
  this->_level = uVar5;
  if (uVar5 != 0) {
    bVar2 = ThreadSafeQueue<cppnet::Log_*>::Empty(&this->_cache_queue);
    if (bVar2) {
      for (uVar4 = 0; uVar4 < this->_cache_size; uVar4 = uVar4 + 1) {
        local_40 = NewLog(this);
        ThreadSafeQueue<cppnet::Log_*>::Push(&this->_cache_queue,&local_40);
      }
      return;
    }
    uVar5 = this->_level;
  }
  if (uVar5 == 0) {
    sVar3 = ThreadSafeQueue<cppnet::Log_*>::Size(&this->_cache_queue);
    local_40 = (Log *)0x0;
    local_38 = (Log *)0x0;
    while (bVar2 = sVar3 != 0, sVar3 = sVar3 - 1, bVar2) {
      bVar2 = ThreadSafeQueue<cppnet::Log_*>::Pop(&this->_cache_queue,&local_40);
      if (bVar2) {
        local_38 = local_40;
        peVar1 = (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar1->_vptr_Alloter[5])(peVar1,&local_38,0);
      }
    }
  }
  return;
}

Assistant:

void BaseLogger::SetLevel(LogLevel level) { 
    _level = level; 
    if (_level > LL_NULL && _cache_queue.Empty()) {
        for (uint16_t i = 0; i < _cache_size; i++) {
            _cache_queue.Push(NewLog());
        }

    } else if (_level == LL_NULL) {
        size_t size = _cache_queue.Size();
        Log* log = nullptr;
        void* del = nullptr;
        for (size_t i = 0; i < size; i++) {
            if (_cache_queue.Pop(log)) {
                del = (void*)log;
                _allocter->Free(del);
            }
        }
    }
}